

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O0

positionTy * __thiscall positionTy::normalize(positionTy *this)

{
  LTError *pLVar1;
  double *pdVar2;
  positionTy *in_RDI;
  double dVar3;
  
  if (((SUB21(in_RDI->f,1) >> 3 & 1) != 0) || ((SUB21(in_RDI->f,1) >> 2 & 1) != 0)) {
    pLVar1 = (LTError *)__cxa_allocate_exception(0x18);
    LTError::LTError(pLVar1,
                     "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/CoordCalc.cpp"
                     ,0x1a0,"normalize",logFATAL,"ASSERT FAILED: %s",
                     "f.unitAngle==UNIT_DEG && f.unitCoord==UNIT_WORLD");
    __cxa_throw(pLVar1,&LTError::typeinfo,LTError::~LTError);
  }
  pdVar2 = lat(in_RDI);
  if (180.0 < *pdVar2) {
    pLVar1 = (LTError *)__cxa_allocate_exception(0x18);
    LTError::LTError(pLVar1,
                     "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/CoordCalc.cpp"
                     ,0x1a3,"normalize",logFATAL,"ASSERT FAILED: %s","lat() <= 180");
    __cxa_throw(pLVar1,&LTError::typeinfo,LTError::~LTError);
  }
  pdVar2 = lat(in_RDI);
  if (*pdVar2 < -180.0) {
    pLVar1 = (LTError *)__cxa_allocate_exception(0x18);
    LTError::LTError(pLVar1,
                     "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/CoordCalc.cpp"
                     ,0x1a4,"normalize",logFATAL,"ASSERT FAILED: %s","lat() >= -180");
    __cxa_throw(pLVar1,&LTError::typeinfo,LTError::~LTError);
  }
  pdVar2 = lat(in_RDI);
  if (90.0 < *pdVar2) {
    pdVar2 = lat(in_RDI);
    dVar3 = *pdVar2;
    pdVar2 = lat(in_RDI);
    *pdVar2 = 180.0 - dVar3;
  }
  pdVar2 = lat(in_RDI);
  if (*pdVar2 <= -90.0 && *pdVar2 != -90.0) {
    pdVar2 = lat(in_RDI);
    dVar3 = *pdVar2;
    pdVar2 = lat(in_RDI);
    *pdVar2 = dVar3 + 180.0;
  }
  pdVar2 = lon(in_RDI);
  if (360.0 < *pdVar2) {
    pLVar1 = (LTError *)__cxa_allocate_exception(0x18);
    LTError::LTError(pLVar1,
                     "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/CoordCalc.cpp"
                     ,0x1a9,"normalize",logFATAL,"ASSERT FAILED: %s","lon() <= 360");
    __cxa_throw(pLVar1,&LTError::typeinfo,LTError::~LTError);
  }
  pdVar2 = lon(in_RDI);
  if (*pdVar2 < -360.0) {
    pLVar1 = (LTError *)__cxa_allocate_exception(0x18);
    LTError::LTError(pLVar1,
                     "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/CoordCalc.cpp"
                     ,0x1aa,"normalize",logFATAL,"ASSERT FAILED: %s","lon() >= -360");
    __cxa_throw(pLVar1,&LTError::typeinfo,LTError::~LTError);
  }
  pdVar2 = lon(in_RDI);
  if (180.0 < *pdVar2) {
    pdVar2 = lon(in_RDI);
    dVar3 = *pdVar2;
    pdVar2 = lon(in_RDI);
    *pdVar2 = dVar3 - 360.0;
  }
  pdVar2 = lon(in_RDI);
  if (*pdVar2 <= -180.0 && *pdVar2 != -180.0) {
    pdVar2 = lon(in_RDI);
    dVar3 = *pdVar2;
    pdVar2 = lon(in_RDI);
    *pdVar2 = dVar3 + 360.0;
  }
  pdVar2 = heading(in_RDI);
  if (*pdVar2 < 360.0) {
    pdVar2 = heading(in_RDI);
    if (-360.0 < *pdVar2) goto LAB_0012fa91;
  }
  pdVar2 = heading(in_RDI);
  dVar3 = fmod(*pdVar2,360.0);
  pdVar2 = heading(in_RDI);
  *pdVar2 = dVar3;
LAB_0012fa91:
  pdVar2 = heading(in_RDI);
  if (*pdVar2 <= 0.0 && *pdVar2 != 0.0) {
    pdVar2 = heading(in_RDI);
    *pdVar2 = *pdVar2 + 360.0;
  }
  return in_RDI;
}

Assistant:

positionTy& positionTy::normalize()
{
    LOG_ASSERT(f.unitAngle==UNIT_DEG && f.unitCoord==UNIT_WORLD);
    
    // latitude: works for -180 <= lat <= 180
    LOG_ASSERT (lat() <= 180);
    LOG_ASSERT (lat() >= -180);
    if ( lat() >  90 ) lat() = 180-lat();      // crossed north pole
    if ( lat() < -90 ) lat() = 180+lat();      // crossed south pole
    
    // longitude: works for -360 <= lon <= 360
    LOG_ASSERT (lon() <= 360);
    LOG_ASSERT (lon() >= -360);
    if ( lon() >  180 ) lon() = lon()-360;      // crossed 180° meridian east-bound
    if ( lon() < -180 ) lon() = lon()+360;      // crossed 180° meridian west-bound
    
    // heading
    if (heading() >= 360.0 || heading() <= -360.0)  // normalize to -360 < head < 360
        heading() = std::fmod(heading(), 360.0);
    if (heading() < 0.0)                            // normalize to 0 <= head < 360
        heading() += 360.0;
    
    // return myself
    return *this;
}